

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chase.cpp
# Opt level: O2

void __thiscall AStarSolver::addToList(AStarSolver *this,int x,int y,coord origin,int base_score)

{
  map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
  *this_00;
  list<int,_std::allocator<int>_> *this_01;
  ItemThing *pIVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined8 in_RAX;
  iterator iVar5;
  mapped_type *pmVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  const_iterator __position;
  int pos;
  int p;
  uint local_38;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  if ((uint)y < 0x20 && (uint)x < 0x50) {
    uVar3 = x << 5 | y;
    if (places[uVar3].p_ch == 0x18) {
      if ((places[uVar3].p_flags & 0x20) != 0) {
        return;
      }
      base_score = base_score + 2;
    }
    else {
      iVar4 = step_ok((int)places[uVar3].p_ch);
      if (iVar4 == 0) {
        return;
      }
    }
    iVar4 = base_score + 4;
    if (places[uVar3].p_monst == (MonsterThing *)0x0) {
      iVar4 = base_score;
    }
    pIVar1 = places[uVar3].p_item;
    if (((pIVar1 == (ItemThing *)0x0) || (pIVar1->type != 8)) || (pIVar1->which != 10)) {
      local_38 = y << 0x10 | x;
      this_00 = &this->info;
      iVar5 = std::
              _Rb_tree<int,_std::pair<const_int,_AStarSolver::AStarInfo>,_std::_Select1st<std::pair<const_int,_AStarSolver::AStarInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
              ::find(&this_00->_M_t,(key_type *)&local_38);
      if (((_Rb_tree_header *)iVar5._M_node != &(this->info)._M_t._M_impl.super__Rb_tree_header) &&
         (pmVar6 = std::
                   map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
                   ::operator[](this_00,(key_type *)&local_38), pmVar6->base_score <= iVar4)) {
        return;
      }
      pmVar6 = std::
               map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
               ::operator[](this_00,(key_type *)&local_38);
      pmVar6->base_score = iVar4;
      pmVar6 = std::
               map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
               ::operator[](this_00,(key_type *)&local_38);
      pmVar6->origin = origin;
      iVar9 = x - (this->end).x;
      iVar2 = -iVar9;
      if (0 < iVar9) {
        iVar2 = iVar9;
      }
      iVar10 = y - (this->end).y;
      iVar9 = -iVar10;
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      this_01 = &this->open_list;
      __position._M_node = (_List_node_base *)this_01;
      do {
        __position._M_node = (__position._M_node)->_M_next;
        if (__position._M_node == (_List_node_base *)this_01) {
          std::__cxx11::list<int,_std::allocator<int>_>::push_back
                    (this_01,(value_type_conflict *)&local_38);
          return;
        }
        local_34 = *(uint *)&__position._M_node[1]._M_next;
        pmVar6 = std::
                 map<int,_AStarSolver::AStarInfo,_std::less<int>,_std::allocator<std::pair<const_int,_AStarSolver::AStarInfo>_>_>
                 ::operator[](this_00,(key_type *)&local_34);
        iVar8 = (local_34 & 0xffff) - (this->end).x;
        iVar10 = -iVar8;
        if (0 < iVar8) {
          iVar10 = iVar8;
        }
        iVar7 = ((int)local_34 >> 0x10) - (this->end).y;
        iVar8 = -iVar7;
        if (0 < iVar7) {
          iVar8 = iVar7;
        }
      } while (iVar10 + pmVar6->base_score + iVar8 <= iVar9 + iVar2 + iVar4);
      std::__cxx11::list<int,_std::allocator<int>_>::insert
                (this_01,__position,(value_type_conflict *)&local_38);
    }
  }
  return;
}

Assistant:

void addToList(int x, int y, coord origin, int base_score)
    {
        if (x < 0 || x >= NUMCOLS || y < 0 || y >= NUMLINES)
            return;
        if (char_at(x, y) == CLOSED_DOOR)
        {
            if (flags_at(x, y) & F_LOCKED)
                return;
            base_score += 2;
        }else{
            if (!step_ok(char_at(x, y)))
                return;
        }
        if (monster_at(x, y))
            base_score += 4;
        if (item_at(x, y) && item_at(x, y)->type == SCROLL && item_at(x, y)->which == S_SCARE)
            return;
        int pos = x | y << 16;
        if (info.find(pos) != info.end())
        {
            if (info[pos].base_score <= base_score)
                return;
        }
        info[pos].base_score = base_score;
        info[pos].origin = origin;
        
        int score = heuristicScore(x, y) + base_score;
        for(auto it=open_list.begin(); it != open_list.end(); it++)
        {
            int p = *it;
            int s = info[p].base_score + heuristicScore(p & 0xFFFF, p >> 16);
            if (score < s)
            {
                open_list.insert(it, pos);
                return;
            }
        }
        open_list.push_back(pos);
    }